

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfindrep.h
# Opt level: O0

void __thiscall
re_replace_arg::set(re_replace_arg *this,vm_val_t *patv,vm_val_t *rplv,int str_to_pat,int32_t flags)

{
  int iVar1;
  re_status_t rVar2;
  re_compiled_pattern *prVar3;
  char *pcVar4;
  int in_ECX;
  int *in_RDX;
  int *in_RSI;
  re_replace_arg *in_RDI;
  int32_t in_R8D;
  re_compiled_pattern **in_stack_00000010;
  size_t in_stack_00000018;
  CVmFuncPtr f;
  CRegexParser *in_stack_00000028;
  re_status_t stat;
  char *str;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  CRegexParser *in_stack_ffffffffffffffb0;
  
  in_RDI->flags = in_R8D;
  if ((*in_RSI == 5) && (iVar1 = CVmObjPattern::is_pattern_obj(0), iVar1 != 0)) {
    create_searcher(in_RDI);
    vm_objp(0);
    prVar3 = CVmObjPattern::get_pattern((CVmObjPattern *)0x301398);
    in_RDI->pat = prVar3;
    in_RDI->our_pat = 0;
  }
  else {
    pcVar4 = vm_val_t::get_as_string
                       ((vm_val_t *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    if (pcVar4 == (char *)0x0) {
      err_throw(0);
    }
    if (in_ECX == 0) {
      in_RDI->pat_str = pcVar4;
    }
    else {
      create_searcher(in_RDI);
      in_stack_ffffffffffffffb0 = G_bif_tads_globals_X->rex_parser;
      vmb_get_len((char *)0x301403);
      rVar2 = CRegexParser::compile_pattern
                        (in_stack_00000028,(char *)f.p_,in_stack_00000018,in_stack_00000010);
      if (rVar2 != RE_STATUS_SUCCESS) {
        in_RDI->pat = (re_compiled_pattern *)0x0;
      }
      in_RDI->our_pat = 1;
    }
  }
  if (*in_RDX == 1) {
    in_RDI->rpl_str = "";
  }
  else {
    pcVar4 = vm_val_t::get_as_string
                       ((vm_val_t *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    if (pcVar4 == (char *)0x0) {
      iVar1 = vm_val_t::is_func_ptr((vm_val_t *)in_RDI);
      if (iVar1 == 0) {
        err_throw(0);
      }
      in_RDI->rpl_str = (char *)0x0;
      iVar1 = in_RDX[1];
      (in_RDI->rpl_func).typ = in_RDX[0];
      *(int *)&(in_RDI->rpl_func).field_0x4 = iVar1;
      (in_RDI->rpl_func).val = *(anon_union_8_8_cb74652f_for_val *)(in_RDX + 2);
      CVmFuncPtr::CVmFuncPtr
                ((CVmFuncPtr *)in_stack_ffffffffffffffb0,
                 (vm_val_t *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      iVar1 = CVmFuncPtr::is_varargs((CVmFuncPtr *)0x3014eb);
      if (iVar1 == 0) {
        iVar1 = CVmFuncPtr::get_max_argc((CVmFuncPtr *)in_stack_ffffffffffffffb0);
      }
      else {
        iVar1 = -1;
      }
      in_RDI->rpl_argc = iVar1;
    }
    else {
      in_RDI->rpl_str = pcVar4;
    }
  }
  return;
}

Assistant:

void set(VMG_ const vm_val_t *patv, const vm_val_t *rplv,
             int str_to_pat, int32_t flags)
    {
        /* save the flags */
        this->flags = flags;

        /* retrieve the compiled RexPattern or uncompiled pattern string */
        const char *str;
        if (patv->typ == VM_OBJ
            && CVmObjPattern::is_pattern_obj(vmg_ patv->val.obj))
        {
            /* create the searcher, if we haven't already */
            create_searcher(vmg0_);

            /* it's a pattern object - get its compiled pattern structure */
            pat = ((CVmObjPattern *)vm_objp(vmg_ patv->val.obj))
                  ->get_pattern(vmg0_);

            /* we didn't create the pattern object */
            our_pat = FALSE;
        }
        else if ((str = patv->get_as_string(vmg0_)) != 0)
        {
            /* it's a string - decide how to treat it */
            if (str_to_pat)
            {
                /* create the searcher */
                create_searcher(vmg0_);

                /* we treat strings as regular expressions - compile it */
                re_status_t stat;
                stat = G_bif_tads_globals->rex_parser->compile_pattern(
                    str + VMB_LEN, vmb_get_len(str), &pat);

                /* if that failed, we don't have a pattern */
                if (stat != RE_STATUS_SUCCESS)
                    pat = 0;

                /* make a note that we allocated the pattern */
                our_pat = TRUE;
            }
            else
            {
                /* we treat strings as simple literal search strings */
                pat_str = str;
            }
        }
        else
        {
            /* invalid type */
            err_throw(VMERR_BAD_TYPE_BIF);
        }

        /* 
         *   Save the replacement value.  This can be a string, nil (which we
         *   treat like an empty string), or a callback function. 
         */
        if (rplv->typ == VM_NIL)
        {
            /* treat it as an empty string */
            rpl_str = "\000\000";
        }
        else if ((str = rplv->get_as_string(vmg0_)) != 0)
        {
            /* save the string value */
            rpl_str = str;
        }
        else if (rplv->is_func_ptr(vmg0_))
        {
            /* it's a function or invokable object */
            rpl_str = 0;
            rpl_func = *rplv;

            /* get the number of arguments it expects */
            CVmFuncPtr f(vmg_ rplv);
            rpl_argc = f.is_varargs() ? -1 : f.get_max_argc();
        }
        else
        {
            /* invalid type */
            err_throw(VMERR_BAD_TYPE_BIF);
        }
    }